

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

void __thiscall dgPolyhedra::DeleteFace(dgPolyhedra *this,dgEdge *face)

{
  uint uVar1;
  dgEdge *pdVar2;
  ulong uVar3;
  ulong uVar4;
  dgEdge *edgeList [16384];
  long alStack_20018 [16384];
  
  if (0 < face->m_incidentFace) {
    uVar1 = 0;
    pdVar2 = face;
    do {
      pdVar2->m_incidentFace = -1;
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          uVar4 = uVar3;
          if (((dgEdge *)alStack_20018[uVar3] == pdVar2) ||
             (((dgEdge *)alStack_20018[uVar3])->m_twin == pdVar2)) break;
          uVar3 = uVar3 + 1;
          uVar4 = (ulong)uVar1;
        } while (uVar1 != uVar3);
      }
      if ((uint)uVar4 == uVar1) {
        alStack_20018[(int)uVar1] = (long)pdVar2;
        uVar1 = uVar1 + 1;
      }
      pdVar2 = pdVar2->m_next;
    } while (pdVar2 != face);
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        if (((dgEdge *)alStack_20018[uVar4])->m_twin->m_incidentFace < 0) {
          DeleteEdge(this,(dgEdge *)alStack_20018[uVar4]);
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  return;
}

Assistant:

void dgPolyhedra::DeleteFace(dgEdge* const face)
{
	dgEdge* edgeList[1024 * 16];

	if (face->m_incidentFace > 0) {
		hacd::HaI32 count = 0;
		dgEdge* ptr = face;
		do {
			ptr->m_incidentFace = -1;
			hacd::HaI32 i = 0;
			for (; i < count; i ++) {
				if ((edgeList[i] == ptr) || (edgeList[i]->m_twin == ptr)) {
					break;
				}
			}
			if (i == count) {
				edgeList[count] = ptr;
				count ++;
			}
			ptr = ptr->m_next;
		} while (ptr != face);


		for (hacd::HaI32 i = 0; i < count; i ++) {
			dgEdge* const ptr = edgeList[i];
			if (ptr->m_twin->m_incidentFace < 0) {
				DeleteEdge (ptr);
			}
		}
	}
}